

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O1

void __thiscall JUnitTestOutput::JUnitTestOutput(JUnitTestOutput *this)

{
  JUnitTestOutputImpl *pJVar1;
  
  TestOutput::TestOutput(&this->super_TestOutput);
  (this->super_TestOutput)._vptr_TestOutput = (_func_int **)&PTR__JUnitTestOutput_002e94d8;
  pJVar1 = (JUnitTestOutputImpl *)
           operator_new(0x70,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/JUnitTestOutput.cpp"
                        ,0x4d);
  (pJVar1->results_).totalCheckCount_ = 0;
  (pJVar1->results_).startTime_ = 0;
  (pJVar1->results_).testCount_ = 0;
  (pJVar1->results_).failureCount_ = 0;
  (pJVar1->results_).groupExecTime_ = 0;
  SimpleString::SimpleString(&(pJVar1->results_).group_,"");
  (pJVar1->results_).head_ = (JUnitTestCaseResultNode *)0x0;
  (pJVar1->results_).tail_ = (JUnitTestCaseResultNode *)0x0;
  SimpleString::SimpleString(&pJVar1->package_,"");
  SimpleString::SimpleString(&pJVar1->stdOutput_,"");
  this->impl_ = pJVar1;
  return;
}

Assistant:

JUnitTestOutput::JUnitTestOutput() :
    impl_(new JUnitTestOutputImpl)
{
}